

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GridDataType0::GridDataType0
          (GridDataType0 *this,KUINT16 SampleType,KUINT16 DataRepresentation,KDataStream *stream)

{
  undefined1 *T;
  pointer *ppuVar1;
  iterator __position;
  ushort uVar2;
  ulong in_RAX;
  ushort uVar3;
  KUINT8 tmp;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  GridData::GridData(&this->super_GridData);
  (this->super_GridData).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridDataType0_002247d0;
  (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GridData).m_ui16SmpTyp = SampleType;
  (this->super_GridData).m_ui16DtRep = DataRepresentation;
  T = &(this->super_GridData).field_0xc;
  KDataStream::Read<unsigned_short>(stream,(unsigned_short *)T);
  uStack_38 = uStack_38 & 0xffffffffffffff;
  uVar2 = *(ushort *)T;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      KDataStream::Read(stream,(KUOCTET *)((long)&uStack_38 + 7));
      __position._M_current =
           (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_vui8DataVals,
                   __position,(KUOCTET *)((long)&uStack_38 + 7));
      }
      else {
        *__position._M_current = uStack_38._7_1_;
        ppuVar1 = &(this->m_vui8DataVals).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      uVar3 = uVar3 + 1;
      uVar2 = *(ushort *)T;
    } while (uVar3 < uVar2);
  }
  if ((uVar2 & 1) != 0) {
    KDataStream::Read(stream,&this->m_ui8Padding);
  }
  return;
}

Assistant:

GridDataType0::GridDataType0( KUINT16 SampleType, KUINT16 DataRepresentation, KDataStream & stream )
{
    m_ui16SmpTyp = SampleType;
    m_ui16DtRep = DataRepresentation;

    stream >> m_ui16NumBytes;

    KUINT8 tmp = 0;
    for( KUINT16 i = 0; i < m_ui16NumBytes; ++i )
    {
        stream >> tmp;
        m_vui8DataVals.push_back( tmp );
    }

    // Do we need to extract any padding?
    if( m_ui16NumBytes % 2 == 1 )
    {
        stream >> m_ui8Padding;
    }
}